

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O2

void __thiscall QDesktopUnixServices::~QDesktopUnixServices(QDesktopUnixServices *this)

{
  Data *pDVar1;
  QObject *pQVar2;
  
  (this->super_QPlatformServices)._vptr_QPlatformServices =
       (_func_int **)&PTR__QDesktopUnixServices_0078c408;
  pDVar1 = (this->m_watcher).wp.d;
  if (((pDVar1 != (Data *)0x0) && ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0))
     && (pQVar2 = (this->m_watcher).wp.value, pQVar2 != (QObject *)0x0)) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  QWeakPointer<QObject>::~QWeakPointer(&(this->m_watcher).wp);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_documentLauncher).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_webBrowser).d);
  return;
}

Assistant:

QDesktopUnixServices::~QDesktopUnixServices()
{
#if QT_CONFIG(dbus)
    delete m_watcher;
#endif
}